

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O2

void aom_yv12_copy_v_c(YV12_BUFFER_CONFIG *src_bc,YV12_BUFFER_CONFIG *dst_bc,int use_crop)

{
  int iVar1;
  long lVar2;
  int iVar3;
  uint8_t *__src;
  void *__src_00;
  uint8_t *__dest;
  void *__dest_00;
  size_t __n;
  bool bVar4;
  
  lVar2 = (ulong)(use_crop != 0) * 0x10;
  __n = (size_t)*(int *)((long)src_bc->store_buf_adr + lVar2 + -0x44);
  iVar1 = *(int *)((long)src_bc->store_buf_adr + lVar2 + -0x3c);
  __src = (src_bc->field_5).field_0.v_buffer;
  __dest = (dst_bc->field_5).field_0.v_buffer;
  if ((src_bc->flags & 8) == 0) {
    iVar3 = 0;
    if (0 < iVar1) {
      iVar3 = iVar1;
    }
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      memcpy(__dest,__src,__n);
      __src = __src + (src_bc->field_4).field_0.uv_stride;
      __dest = __dest + (dst_bc->field_4).field_0.uv_stride;
    }
  }
  else {
    __src_00 = (void *)((long)__src * 2);
    __dest_00 = (void *)((long)__dest * 2);
    iVar3 = 0;
    if (0 < iVar1) {
      iVar3 = iVar1;
    }
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      memcpy(__dest_00,__src_00,__n * 2);
      __src_00 = (void *)((long)__src_00 + (long)(src_bc->field_4).field_0.uv_stride * 2);
      __dest_00 = (void *)((long)__dest_00 + (long)(dst_bc->field_4).field_0.uv_stride * 2);
    }
  }
  return;
}

Assistant:

void aom_yv12_copy_v_c(const YV12_BUFFER_CONFIG *src_bc,
                       YV12_BUFFER_CONFIG *dst_bc, int use_crop) {
  int row;
  int width = use_crop ? src_bc->uv_crop_width : src_bc->uv_width;
  int height = use_crop ? src_bc->uv_crop_height : src_bc->uv_height;
  const uint8_t *src = src_bc->v_buffer;
  uint8_t *dst = dst_bc->v_buffer;
#if CONFIG_AV1_HIGHBITDEPTH
  if (src_bc->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *src16 = CONVERT_TO_SHORTPTR(src);
    uint16_t *dst16 = CONVERT_TO_SHORTPTR(dst);
    for (row = 0; row < height; ++row) {
      memcpy(dst16, src16, width * sizeof(uint16_t));
      src16 += src_bc->uv_stride;
      dst16 += dst_bc->uv_stride;
    }
    return;
  }
#endif
  for (row = 0; row < height; ++row) {
    memcpy(dst, src, width);
    src += src_bc->uv_stride;
    dst += dst_bc->uv_stride;
  }
}